

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Minefield_State_PDU::Minefield_State_PDU(Minefield_State_PDU *this)

{
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_State_PDU_002179f8;
  this->m_ui8ForceID = '\0';
  this->m_ui8NumPerimPoints = '\0';
  DATA_TYPE::EntityType::EntityType(&this->m_MinefieldType);
  this->m_ui16NumMineTypes = 0;
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Loc);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori);
  DATA_TYPE::MinefieldAppearance::MinefieldAppearance(&this->m_App);
  (this->m_vMineTypes).
  super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vMineTypes).
  super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vMineTypes).
  super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '%';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x48;
  (this->m_SeqNumUnion).m_ui16SeqNum = 0;
  (this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16 = 0;
  return;
}

Assistant:

Minefield_State_PDU::Minefield_State_PDU() :
    m_ui8ForceID( 0 ),
    m_ui8NumPerimPoints( 0 ),
    m_ui16NumMineTypes( 0 )
{
    m_ui8PDUType = MinefieldState_PDU_Type;
    m_ui16PDULength = MINEFIELD_STATE_PDU_SIZE;
    m_SeqNumUnion.m_ui16SeqNum = 0;
    m_ui16ProtocolModeUnion.m_ui16ProtocolMode16 = 0;
}